

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

Mesh * __thiscall SceneParser::parseTriangleMesh(SceneParser *this)

{
  int iVar1;
  size_t sVar2;
  Mesh *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_118;
  char token [100];
  char acStack_8c [4];
  char filename [100];
  
  getToken(this,token);
  if (token._0_2_ != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1a4,"Mesh *SceneParser::parseTriangleMesh()");
  }
  getToken(this,token);
  iVar1 = bcmp(token,"obj_file",9);
  if (iVar1 != 0) {
    __assert_fail("!strcmp(token, \"obj_file\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1a6,"Mesh *SceneParser::parseTriangleMesh()");
  }
  getToken(this,filename);
  getToken(this,token);
  if (token._0_2_ != 0x7d) {
    __assert_fail("!strcmp(token, \"}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x1a9,"Mesh *SceneParser::parseTriangleMesh()");
  }
  sVar2 = strlen(filename);
  iVar1 = strcmp(acStack_8c + sVar2,".obj");
  if (iVar1 == 0) {
    this_00 = (Mesh *)operator_new(0xe8);
    std::operator+(&bStack_118,&this->_basepath,filename);
    Mesh::Mesh(this_00,&bStack_118,this->_current_material);
    std::__cxx11::string::~string((string *)&bStack_118);
    return this_00;
  }
  __assert_fail("!strcmp(ext, \".obj\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x1ab,"Mesh *SceneParser::parseTriangleMesh()");
}

Assistant:

Mesh *
SceneParser::parseTriangleMesh() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    char filename[MAX_PARSER_TOKEN_LENGTH];
    // get the filename
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "obj_file"));
    getToken(filename);
    getToken(token);
    assert(!strcmp(token, "}"));
    const char *ext = &filename[strlen(filename) - 4];
    assert(!strcmp(ext, ".obj"));
    Mesh *answer = new Mesh(_basepath + filename, _current_material);

    return answer;
}